

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint
          (btGeneric6DofSpringConstraint *this,btRigidBody *rbA,btRigidBody *rbB,
          btTransform *frameInA,btTransform *frameInB,bool useLinearReferenceFrameA)

{
  EVP_PKEY_CTX *in_RSI;
  btGeneric6DofSpringConstraint *in_RDI;
  btRigidBody *in_stack_00000048;
  btGeneric6DofConstraint *in_stack_00000050;
  
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (in_stack_00000050,in_stack_00000048,(btRigidBody *)this,(btTransform *)rbA,
             (btTransform *)rbB,frameInA._7_1_);
  (in_RDI->super_btGeneric6DofConstraint).super_btTypedConstraint._vptr_btTypedConstraint =
       (_func_int **)&PTR__btGeneric6DofSpringConstraint_002e7128;
  init(in_RDI,in_RSI);
  return;
}

Assistant:

btGeneric6DofSpringConstraint::btGeneric6DofSpringConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB ,bool useLinearReferenceFrameA)
	: btGeneric6DofConstraint(rbA, rbB, frameInA, frameInB, useLinearReferenceFrameA)
{
    init();
}